

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

Literal __thiscall
Clasp::Solver::popVars(Solver *this,uint32 num,bool popLearnt,ConstraintDB *popAux)

{
  size_type *psVar1;
  pointer plVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_type sVar6;
  pointer pIVar7;
  pointer pLVar8;
  pointer ppCVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  undefined4 extraout_var;
  Literal *pLVar13;
  uint32 uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long *plVar22;
  uint uVar23;
  uint uVar24;
  size_type ns;
  ulong uVar25;
  LitVec cc;
  Antecedent local_58;
  ulong uStack_50;
  ConstraintDB *local_40;
  ulong local_38;
  
  uVar23 = (this->assign_).assign_.ebo_.size - num;
  uVar3 = uVar23 * 4;
  uVar10 = (this->levels_).super_type.ebo_.size + 1;
  uVar19 = (ulong)(this->impliedLits_).lits.ebo_.size;
  if (uVar19 != 0) {
    pIVar7 = (this->impliedLits_).lits.ebo_.buf;
    lVar21 = 0;
    do {
      if ((uVar3 >> 1 <= *(uint *)((long)&(pIVar7->lit).rep_ + lVar21) >> 1) &&
         (uVar24 = *(uint *)((long)&pIVar7->level + lVar21), uVar24 < uVar10)) {
        uVar10 = uVar24;
      }
      lVar21 = lVar21 + 0x18;
    } while (uVar19 * 0x18 != lVar21);
  }
  local_38 = (ulong)(uVar23 & 0x3fffffff);
  if (num != 0) {
    uVar19 = local_38;
    uVar14 = num;
    do {
      uVar23 = (this->assign_).assign_.ebo_.buf[uVar19];
      uVar24 = uVar23 >> 4;
      if (uVar10 <= uVar24) {
        uVar24 = uVar10;
      }
      if ((uVar23 & 3) == 0) {
        uVar24 = uVar10;
      }
      uVar10 = uVar24;
      uVar19 = (ulong)((int)uVar19 + 1);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  uVar23 = (this->levels_).root;
  local_40 = popAux;
  if (uVar23 < uVar10) {
    undoUntil(this,uVar10 - 1,2);
  }
  else {
    popRootLevel(this,(uVar23 - uVar10) + 1,(LitVec *)0x0,true);
    if (uVar10 == 0) {
      uVar10 = this->shared_->lastTopLevel_;
      uVar23 = (this->assign_).units_;
      uVar24 = (this->assign_).front;
      uVar11 = *(uint *)&this->field_0x204 & 0x3fffffff;
      uVar4 = (this->assign_).trail.ebo_.size;
      if (uVar10 != uVar4) {
        pLVar8 = (this->assign_).trail.ebo_.buf;
        uVar20 = uVar24;
        uVar15 = uVar23;
        uVar16 = uVar11;
        uVar18 = uVar10;
        do {
          uVar5 = pLVar8[uVar18].rep_;
          if (uVar5 >> 1 < uVar3 >> 1) {
            uVar19 = (ulong)uVar10;
            uVar10 = uVar10 + 1;
            pLVar8[uVar19].rep_ = uVar5;
          }
          else {
            uVar15 = uVar15 - (uVar18 < uVar23);
            uVar20 = uVar20 - (uVar18 < uVar24);
            uVar16 = uVar16 - (uVar18 < uVar11);
          }
          uVar18 = uVar18 + 1;
        } while (uVar4 != uVar18);
        uVar11 = uVar16 & 0x3fffffff;
        uVar24 = uVar20;
        uVar23 = uVar15;
      }
      (this->assign_).trail.ebo_.size = uVar10;
      (this->assign_).front = uVar24;
      (this->assign_).units_ = uVar23;
      *(uint *)&this->field_0x204 = *(uint *)&this->field_0x204 & 0xc0000000 | uVar11;
    }
  }
  uVar14 = num;
  if (num != 0) {
    do {
      plVar2 = (this->watches_).ebo_.buf + ((this->watches_).ebo_.size - 1);
      if (*(int *)&(plVar2->super_type).
                   super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8 < 0) {
        operator_delete((plVar2->super_type).
                        super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_);
      }
      (plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ =
           (buf_type *)0x0;
      *(undefined8 *)
       &(plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8
           = 0;
      (plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ = 0;
      sVar6 = (this->watches_).ebo_.size;
      (this->watches_).ebo_.size = sVar6 - 1;
      plVar2 = (this->watches_).ebo_.buf + (sVar6 - 2);
      if (*(int *)&(plVar2->super_type).
                   super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8 < 0) {
        operator_delete((plVar2->super_type).
                        super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_);
      }
      uVar14 = uVar14 - 1;
      (plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ =
           (buf_type *)0x0;
      *(undefined8 *)
       &(plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8
           = 0;
      (plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ = 0;
      psVar1 = &(this->watches_).ebo_.size;
      *psVar1 = *psVar1 - 1;
    } while (uVar14 != 0);
  }
  if (popLearnt) {
    SharedContext::report(this->shared_,"removing aux constraints",this);
    uVar19 = (ulong)(this->learnts_).ebo_.size;
    local_58.data_ = 0;
    uStack_50 = 0;
    if (uVar19 == 0) {
      uVar10 = 0;
    }
    else {
      uVar25 = 0;
      uVar17 = 0;
      do {
        ppCVar9 = (this->learnts_).ebo_.buf;
        ppCVar9[uVar17] = ppCVar9[uVar25];
        iVar12 = (*(this->learnts_).ebo_.buf[uVar25]->_vptr_Constraint[9])();
        plVar22 = (long *)CONCAT44(extraout_var,iVar12);
        uVar10 = (uint)uVar17 + 1;
        if ((plVar22 != (long *)0x0) && (0x3fffffff < *(uint *)(plVar22 + 2))) {
          uStack_50 = uStack_50 & 0xffffffff00000000;
          (**(code **)(*plVar22 + 0xa0))(plVar22,&local_58);
          pLVar13 = std::
                    __find_if<Clasp::Literal*,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::binder2nd<std::less<Clasp::Literal>>>>>
                              (local_58.data_,
                               (void *)(local_58.data_ + (uStack_50 & 0xffffffff) * 4),uVar3);
          if (pLVar13 != (Literal *)((uStack_50 & 0xffffffff) * 4 + local_58.data_)) {
            (**(code **)(*plVar22 + 0x28))(plVar22,this,1);
            uVar10 = (uint)uVar17;
          }
        }
        uVar25 = uVar25 + 1;
        uVar17 = (ulong)uVar10;
      } while (uVar19 != uVar25);
    }
    (this->learnts_).ebo_.size = uVar10;
    if ((void *)local_58.data_ != (void *)0x0) {
      operator_delete((void *)local_58.data_);
    }
  }
  if (local_40 != (ConstraintDB *)0x0) {
    destroyDB(this,local_40);
  }
  ns = (this->assign_).assign_.ebo_.size - num;
  local_58.data_ = local_58.data_ & 0xffffffff00000000;
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(this->assign_).assign_,ns,(uint *)&local_58);
  local_58.data_ = 0;
  bk_lib::pod_vector<Clasp::Antecedent,_std::allocator<Clasp::Antecedent>_>::resize
            (&(this->assign_).reason_.super_type,ns,&local_58);
  if ((this->assign_).assign_.ebo_.size - 1 < (this->tag_).rep_ >> 2) {
    (this->tag_).rep_ = 0;
  }
  plVar22 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  (**(code **)(*plVar22 + 0x30))(plVar22,this,local_38,num);
  return (Literal)uVar3;
}

Assistant:

Literal Solver::popVars(uint32 num, bool popLearnt, ConstraintDB* popAux) {
	Literal pop = posLit(assign_.numVars() - num);
	uint32  dl  = decisionLevel() + 1;
	for (ImpliedList::iterator it = impliedLits_.begin(); it != impliedLits_.end(); ++it) {
		if (!(it->lit < pop)) { dl = std::min(dl, it->level); }
	}
	for (Var v = pop.var(), end = pop.var()+num; v != end; ++v) {
		if (value(v) != value_free) { dl = std::min(dl, level(v)); }
	}
	// 1. remove aux vars from assignment and watch lists
	if (dl > rootLevel()) {
		undoUntil(dl-1, undo_pop_proj_level);
	}
	else {
		popRootLevel((rootLevel() - dl) + 1);
		if (dl == 0) { // top-level has aux vars - cleanup manually
			uint32 j = shared_->numUnary();
			uint32 nUnits = assign_.units(), nFront = assign_.front, nSimps = lastSimp_;
			for (uint32 i = j, end = sizeVec(assign_.trail), endUnits = nUnits, endFront = nFront, endSimps = lastSimp_; i != end; ++i) {
				if (assign_.trail[i] < pop) { assign_.trail[j++] = assign_.trail[i]; }
				else {
					nUnits -= (i < endUnits);
					nFront -= (i < endFront);
					nSimps -= (i < endSimps);
				}
			}
			shrinkVecTo(assign_.trail, j);
			assign_.front = nFront;
			assign_.setUnits(nUnits);
			lastSimp_ = nSimps;
		}
	}
	for (uint32 n = num; n--;) {
		watches_.back().clear(true);
		watches_.pop_back();
		watches_.back().clear(true);
		watches_.pop_back();
	}
	// 2. remove learnt constraints over aux
	if (popLearnt) {
		shared_->report("removing aux constraints", this);
		ConstraintDB::size_type i, j, end = learnts_.size();
		LitVec cc;
		for (i = j = 0; i != end; ++i) {
			learnts_[j++] = learnts_[i];
			ClauseHead* c = learnts_[i]->clause();
			if (c && c->aux()) {
				cc.clear();
				c->toLits(cc);
				if (std::find_if(cc.begin(), cc.end(), std::not1(std::bind2nd(std::less<Literal>(), pop))) != cc.end()) {
					c->destroy(this, true);
					--j;
				}
			}
		}
		learnts_.erase(learnts_.begin()+j, learnts_.end());
	}
	if (popAux) { destroyDB(*popAux); }
	// 3. remove vars from solver and heuristic
	assign_.resize(assign_.numVars()-num);
	if (!validVar(tag_.var())) { tag_ = lit_true(); }
	heuristic_->updateVar(*this, pop.var(), num);
	return pop;
}